

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O0

void __thiscall cmCTestSubmitCommand::cmCTestSubmitCommand(cmCTestSubmitCommand *this)

{
  reference ppcVar1;
  cmCTestSubmitCommand *this_local;
  
  cmCTestHandlerCommand::cmCTestHandlerCommand(&this->super_cmCTestHandlerCommand);
  (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestSubmitCommand_00b86c60;
  std::set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>::set
            (&this->Parts);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->Files);
  std::__cxx11::string::string((string *)&this->RetryCount);
  std::__cxx11::string::string((string *)&this->RetryDelay);
  std::__cxx11::string::string((string *)&this->CDashUploadFile);
  std::__cxx11::string::string((string *)&this->CDashUploadType);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->HttpHeaders);
  std::__cxx11::string::string((string *)&this->SubmitURL);
  this->PartsMentioned = false;
  this->FilesMentioned = false;
  this->InternalTest = false;
  std::__cxx11::string::operator=((string *)&this->RetryCount,"");
  std::__cxx11::string::operator=((string *)&this->RetryDelay,"");
  this->CDashUpload = false;
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,6);
  *ppcVar1 = "BUILD_ID";
  (this->super_cmCTestHandlerCommand).Last = 7;
  return;
}

Assistant:

cmCTestSubmitCommand::cmCTestSubmitCommand()
{
  this->PartsMentioned = false;
  this->FilesMentioned = false;
  this->InternalTest = false;
  this->RetryCount = "";
  this->RetryDelay = "";
  this->CDashUpload = false;
  this->Arguments[cts_BUILD_ID] = "BUILD_ID";
  this->Last = cts_LAST;
}